

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pmovmskb_mips64(uint64_t fs)

{
  uint uVar1;
  
  uVar1 = (uint)(fs >> 0x20);
  return (ulong)(uVar1 >> 0x11 & 0x40 | (byte)(fs >> 0x38) & 0xffffff80 |
                uVar1 >> 10 & 0x20 |
                uVar1 >> 3 & 0x10 |
                ((uint)(fs >> 0x15) & 4 | (uint)(fs >> 0xe) & 2 | (uint)(fs >> 7) & 1) +
                ((int)fs >> 0x1f) * -8);
}

Assistant:

uint64_t helper_pmovmskb(uint64_t fs)
{
    unsigned fd = 0;

    fd |= ((fs >>  7) & 1) << 0;
    fd |= ((fs >> 15) & 1) << 1;
    fd |= ((fs >> 23) & 1) << 2;
    fd |= ((fs >> 31) & 1) << 3;
    fd |= ((fs >> 39) & 1) << 4;
    fd |= ((fs >> 47) & 1) << 5;
    fd |= ((fs >> 55) & 1) << 6;
    fd |= ((fs >> 63) & 1) << 7;

    return fd & 0xff;
}